

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

int float32_is_signaling_nan_mips(float32 a_,float_status *status)

{
  uint32_t a;
  bool bVar1;
  
  if (status->snan_bit_is_one == '\0') {
    bVar1 = (a_ & 0x3fffff) != 0 && (a_ & 0x7fc00000) == 0x7f800000;
  }
  else {
    bVar1 = 0xff7fffff < a_ * 2;
  }
  return (int)bVar1;
}

Assistant:

int float32_is_signaling_nan(float32 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    uint32_t a = float32_val(a_);
    if (snan_bit_is_one(status)) {
        return ((uint32_t)(a << 1) >= 0xFF800000);
    } else {
        return (((a >> 22) & 0x1FF) == 0x1FE) && (a & 0x003FFFFF);
    }
#endif
}